

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseFilters::TestCaseFilters(TestCaseFilters *this,string *name)

{
  (this->m_exclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_exclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tagExpressions).
  super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tagExpressions).
  super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tagExpressions).
  super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_exclusionFilters).
  super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  return;
}

Assistant:

TestCaseFilters( std::string const& name ) : m_name( name ) {}